

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O2

void __thiscall Lodtalk::StackPage::divorceAllFrames(StackPage *this)

{
  uint8_t *puVar1;
  long lVar2;
  long *plVar3;
  StackFrame local_28;
  
  local_28.stackPointer = (this->headFrame).stackPointer;
  for (local_28.framePointer = (this->headFrame).framePointer;
      local_28.framePointer != (uint8_t *)0x0;
      local_28.framePointer = *(uint8_t **)local_28.framePointer) {
    StackFrame::ensureHasUpdatedMarriedSpouse(&local_28,this->context);
    local_28.stackPointer =
         local_28.framePointer + (ulong)(*(uint *)(local_28.framePointer + -0x10) & 0xff) * 8 + 0x18
    ;
  }
  if ((this->nextPage != (StackPage *)0x0) &&
     (puVar1 = this->nextPage->baseFramePointer, puVar1 != (uint8_t *)0x0)) {
    *(long *)(*(long *)((this->headFrame).framePointer + -0x18) + 0x10) =
         *(long *)(puVar1 + 8) * 2 + 1;
    plVar3 = (long *)(this->headFrame).framePointer;
    while( true ) {
      local_28.stackPointer = (uint8_t *)(plVar3 + (ulong)(*(uint *)(plVar3 + -2) & 0xff) + 3);
      local_28.framePointer = (uint8_t *)*plVar3;
      if (local_28.framePointer == (uint8_t *)0x0) break;
      lVar2 = *(long *)((long)local_28.framePointer + -0x18);
      *(long *)(plVar3[-3] + 8) = lVar2;
      *(long *)(lVar2 + 0x10) = plVar3[1] * 2 + 1;
      plVar3 = (long *)local_28.framePointer;
    }
    freed(this);
    return;
  }
  __assert_fail("nextPage && nextPage->isInUse()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                ,0x32,"void Lodtalk::StackPage::divorceAllFrames()");
}

Assistant:

void StackPage::divorceAllFrames()
{
    // First pass. Ensure the frames are married and that they have their context updated.
    auto currentFrame = headFrame;
    while (currentFrame.framePointer != 0)
    {
        currentFrame.ensureHasUpdatedMarriedSpouse(context);
        currentFrame = currentFrame.getPreviousFrame();
    }

    // Get the head frame pc from the next page
    assert(nextPage && nextPage->isInUse());
    {
        StackFrame nextBaseFrame(nextPage->baseFramePointer);
        auto headContext = reinterpret_cast<Context*> (headFrame.getThisContext().pointer);
        headContext->pc = Oop::encodeSmallInteger(nextBaseFrame.getReturnPointer());
    }

    // Second pass. Divorce
    auto nextFrame = headFrame;
    currentFrame = headFrame.getPreviousFrame();
    while (currentFrame.framePointer != 0)
    {
        auto currentContext = reinterpret_cast<Context*> (currentFrame.getThisContext().pointer);
        auto nextContext = reinterpret_cast<Context*> (nextFrame.getThisContext().pointer);
        nextContext->sender = Oop::fromPointer(currentContext);
        currentContext->pc = Oop::encodeSmallInteger(nextFrame.getReturnPointer());

        nextFrame = currentFrame;
        currentFrame = currentFrame.getPreviousFrame();
    }

    freed();
}